

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_seqdiff.cpp
# Opt level: O2

void __thiscall argparse::args_t::parse_input(args_t *this,char *str)

{
  FILE *pFVar1;
  
  pFVar1 = _stdin;
  if ((str != (char *)0x0) && ((*str != '-' || (str[1] != '\0')))) {
    pFVar1 = fopen(str,"rb");
  }
  this->input = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    ERROR("failed to open the INPUT file %s",str);
    return;
  }
  return;
}

Assistant:

void args_t::parse_input( const char * str )
  {
    if ( str && strcmp( str, "-" ) )
      input = fopen( str, "rb" );
    else
      input = stdin;
    
    if ( input == NULL )
      ERROR( "failed to open the INPUT file %s", str );
  }